

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loclikely.cpp
# Opt level: O0

int32_t parseTagString(char *localeID,char *lang,int32_t *langLength,char *script,
                      int32_t *scriptLength,char *region,int32_t *regionLength,UErrorCode *err)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  size_t sVar4;
  char *pcStack_40;
  int32_t subtagLength;
  char *position;
  char *region_local;
  int32_t *scriptLength_local;
  char *script_local;
  int32_t *langLength_local;
  char *lang_local;
  char *localeID_local;
  
  pcStack_40 = localeID;
  position = region;
  region_local = (char *)scriptLength;
  scriptLength_local = (int32_t *)script;
  script_local = (char *)langLength;
  langLength_local = (int32_t *)lang;
  lang_local = localeID;
  UVar1 = U_FAILURE(*err);
  if (((((UVar1 == '\0') && (lang_local != (char *)0x0)) && (langLength_local != (int32_t *)0x0)) &&
      ((script_local != (char *)0x0 && (scriptLength_local != (int32_t *)0x0)))) &&
     ((region_local != (char *)0x0 &&
      ((position != (char *)0x0 && (regionLength != (int32_t *)0x0)))))) {
    iVar2 = ulocimp_getLanguage_63
                      (pcStack_40,(char *)langLength_local,*(int32_t *)script_local,
                       &stack0xffffffffffffffc0);
    u_terminateChars_63((char *)langLength_local,*(int32_t *)script_local,iVar2,err);
    UVar1 = U_FAILURE(*err);
    if (UVar1 == '\0') {
      *(int32_t *)script_local = iVar2;
      if (*(int *)script_local == 0) {
        strcpy((char *)langLength_local,"und");
        sVar4 = strlen((char *)langLength_local);
        *(int *)script_local = (int)sVar4;
      }
      if ((*pcStack_40 == '_') || (*pcStack_40 == '-')) {
        pcStack_40 = pcStack_40 + 1;
      }
      iVar2 = ulocimp_getScript_63
                        (pcStack_40,(char *)scriptLength_local,*(int32_t *)region_local,
                         &stack0xffffffffffffffc0);
      u_terminateChars_63((char *)scriptLength_local,*(int32_t *)region_local,iVar2,err);
      UVar1 = U_FAILURE(*err);
      if (UVar1 == '\0') {
        *(int32_t *)region_local = iVar2;
        if (0 < *(int *)region_local) {
          iVar3 = uprv_strnicmp_63((char *)scriptLength_local,"Zzzz",*(uint32_t *)region_local);
          if (iVar3 == 0) {
            region_local[0] = '\0';
            region_local[1] = '\0';
            region_local[2] = '\0';
            region_local[3] = '\0';
          }
          if ((*pcStack_40 == '_') || (*pcStack_40 == '-')) {
            pcStack_40 = pcStack_40 + 1;
          }
        }
        iVar2 = ulocimp_getCountry_63(pcStack_40,position,*regionLength,&stack0xffffffffffffffc0);
        u_terminateChars_63(position,*regionLength,iVar2,err);
        UVar1 = U_FAILURE(*err);
        if (UVar1 == '\0') {
          *regionLength = iVar2;
          if (*regionLength < 1) {
            if ((*pcStack_40 != '\0') && (*pcStack_40 != '@')) {
              pcStack_40 = pcStack_40 + -1;
            }
          }
          else {
            iVar3 = uprv_strnicmp_63(position,"ZZ",*regionLength);
            if (iVar3 == 0) {
              *regionLength = 0;
            }
          }
          goto LAB_00334c3a;
        }
      }
    }
  }
  UVar1 = U_FAILURE(*err);
  if (UVar1 == '\0') {
    *err = U_ILLEGAL_ARGUMENT_ERROR;
  }
LAB_00334c3a:
  return (int)pcStack_40 - (int)lang_local;
}

Assistant:

static int32_t U_CALLCONV
parseTagString(
    const char* localeID,
    char* lang,
    int32_t* langLength,
    char* script,
    int32_t* scriptLength,
    char* region,
    int32_t* regionLength,
    UErrorCode* err)
{
    const char* position = localeID;
    int32_t subtagLength = 0;

    if(U_FAILURE(*err) ||
       localeID == NULL ||
       lang == NULL ||
       langLength == NULL ||
       script == NULL ||
       scriptLength == NULL ||
       region == NULL ||
       regionLength == NULL) {
        goto error;
    }

    subtagLength = ulocimp_getLanguage(position, lang, *langLength, &position);
    u_terminateChars(lang, *langLength, subtagLength, err);

    /*
     * Note that we explicit consider U_STRING_NOT_TERMINATED_WARNING
     * to be an error, because it indicates the user-supplied tag is
     * not well-formed.
     */
    if(U_FAILURE(*err)) {
        goto error;
    }

    *langLength = subtagLength;

    /*
     * If no language was present, use the value of unknownLanguage
     * instead.  Otherwise, move past any separator.
     */
    if (*langLength == 0) {
        uprv_strcpy(
            lang,
            unknownLanguage);
        *langLength = (int32_t)uprv_strlen(lang);
    }
    if (_isIDSeparator(*position)) {
        ++position;
    }

    subtagLength = ulocimp_getScript(position, script, *scriptLength, &position);
    u_terminateChars(script, *scriptLength, subtagLength, err);

    if(U_FAILURE(*err)) {
        goto error;
    }

    *scriptLength = subtagLength;

    if (*scriptLength > 0) {
        if (uprv_strnicmp(script, unknownScript, *scriptLength) == 0) {
            /**
             * If the script part is the "unknown" script, then don't return it.
             **/
            *scriptLength = 0;
        }

        /*
         * Move past any separator.
         */
        if (_isIDSeparator(*position)) {
            ++position;
        }    
    }

    subtagLength = ulocimp_getCountry(position, region, *regionLength, &position);
    u_terminateChars(region, *regionLength, subtagLength, err);

    if(U_FAILURE(*err)) {
        goto error;
    }

    *regionLength = subtagLength;

    if (*regionLength > 0) {
        if (uprv_strnicmp(region, unknownRegion, *regionLength) == 0) {
            /**
             * If the region part is the "unknown" region, then don't return it.
             **/
            *regionLength = 0;
        }
    } else if (*position != 0 && *position != '@') {
        /* back up over consumed trailing separator */
        --position;
    }

exit:

    return (int32_t)(position - localeID);

error:

    /**
     * If we get here, we have no explicit error, it's the result of an
     * illegal argument.
     **/
    if (!U_FAILURE(*err)) {
        *err = U_ILLEGAL_ARGUMENT_ERROR;
    }

    goto exit;
}